

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::t_formatter<spdlog::details::null_scoped_padder>::format
          (t_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  byte abStack_12 [5];
  undefined2 local_d;
  char local_b [3];
  char *local_8;
  
  uVar2 = msg->thread_id;
  pcVar3 = local_b;
  uVar4 = uVar2;
  if (99 < uVar2) {
    do {
      uVar2 = uVar4 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar4 % 100) * 2);
      pcVar3 = pcVar3 + -2;
      bVar1 = 9999 < uVar4;
      uVar4 = uVar2;
    } while (bVar1);
  }
  if (uVar2 < 10) {
    pcVar3[-1] = (byte)uVar2 | 0x30;
    local_8 = pcVar3 + -1;
  }
  else {
    *(undefined2 *)(pcVar3 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + uVar2 * 2);
    local_8 = pcVar3 + -2;
  }
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_8,local_b);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }